

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::PatchPutRootValue<true,Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               PropertyOperationFlags flags)

{
  byte *pbVar1;
  Type TVar2;
  undefined8 requestContext;
  bool bVar3;
  ImplicitCallFlags IVar4;
  ImplicitCallFlags IVar5;
  BOOL BVar6;
  RecyclableObject *object;
  undefined1 local_98 [8];
  PropertyValueInfo info;
  
  info._56_8_ = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  object = VarTo<Js::RecyclableObject>(instance);
  local_98 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_98,functionBody,inlineCache,inlineCacheIndex,false);
  requestContext = info._56_8_;
  bVar3 = CacheOperators::TrySetProperty<true,true,true,true,false,true,false,false>
                    (object,true,propertyId,newValue,(ScriptContext *)info._56_8_,flags,
                     (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_98);
  if (!bVar3) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
    if ((bVar3) && (DAT_0145948a == '\x01')) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchPutRootValue",propertyId,(ScriptContext *)requestContext,object)
      ;
    }
    TVar2 = (functionBody->super_ParseableFunctionInfo).flags;
    IVar4 = ImplicitCall_None;
    if ((TVar2 & Flags_HasOnlyThisStatements) != Flags_None) {
      IVar4 = CacheAndClearImplicitBit((ScriptContext *)requestContext);
    }
    BVar6 = SetRootProperty(object,propertyId,newValue,(PropertyValueInfo *)local_98,
                            (ScriptContext *)requestContext,flags);
    if (BVar6 == 0) {
      pbVar1 = (byte *)(*(long *)(requestContext + 0x3b8) + 0x1570);
      *pbVar1 = *pbVar1 | 0x41;
    }
    if ((TVar2 & Flags_HasOnlyThisStatements) != Flags_None) {
      IVar5 = CheckAndUpdateFunctionBodyWithImplicitFlag(functionBody);
      *(ImplicitCallFlags *)(*(long *)(requestContext + 0x3b8) + 0x1570) = IVar5 | IVar4;
    }
  }
  return;
}

Assistant:

inline void JavascriptOperators::PatchPutRootValue(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutRootValue);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        RecyclableObject* object = VarTo<RecyclableObject>(instance);
        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        if (CacheOperators::TrySetProperty<true, true, true, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
                object, true, propertyId, newValue, scriptContext, flags, nullptr, &info))
        {
            return;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchPutRootValue"), propertyId, scriptContext, object);
        }
#endif

        ImplicitCallFlags prevImplicitCallFlags = ImplicitCall_None;
        ImplicitCallFlags currImplicitCallFlags = ImplicitCall_None;
        bool hasThisOnlyStatements = functionBody->GetHasOnlyThisStmts();
        if (hasThisOnlyStatements)
        {
            prevImplicitCallFlags = CacheAndClearImplicitBit(scriptContext);
        }
        if (!JavascriptOperators::SetRootProperty(object, propertyId, newValue, &info, scriptContext, flags))
        {
            // Add implicit call flags, to bail out if field copy prop may propagate the wrong value.
            scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
        }
        if (hasThisOnlyStatements)
        {
            currImplicitCallFlags = CheckAndUpdateFunctionBodyWithImplicitFlag(functionBody);
            RestoreImplicitFlag(scriptContext, prevImplicitCallFlags, currImplicitCallFlags);
        }
        JIT_HELPER_END(Op_PatchPutRootValue);
    }